

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall efsw::String::replace(String *this,Iterator i1,Iterator i2,char *s)

{
  String tmp;
  String local_40;
  
  String(&local_40,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,(long)i1._M_current - (long)(this->mString)._M_dataplus._M_p >> 2,
          (long)i2._M_current - (long)i1._M_current >> 2,local_40.mString._M_dataplus._M_p,
          local_40.mString._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40.mString._M_dataplus._M_p != &local_40.mString.field_2) {
    operator_delete(local_40.mString._M_dataplus._M_p);
  }
  return this;
}

Assistant:

String& String::replace( Iterator i1, Iterator i2, const char* s ) {
	String tmp( s );

	mString.replace( i1, i2, tmp.mString );

	return *this;
}